

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_AEAD_Chacha20Poly1305_Simd128.c
# Opt level: O2

void poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx,uint32_t len,uint8_t *text)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  Lib_IntVector_Intrinsics_vec128 *acc;
  uint uVar16;
  uint8_t *text0;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar25;
  undefined1 auVar23 [16];
  uint uVar31;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Lib_IntVector_Intrinsics_vec128 in_XMM2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar51;
  undefined1 auVar52 [16];
  ulong uVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  ulong uVar57;
  undefined1 auVar58 [16];
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint8_t tmp [16];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_48 [16];
  uint uVar24;
  
  uVar16 = len & 0xffffffe0;
  if (uVar16 != 0) {
    Hacl_MAC_Poly1305_Simd128_load_acc2(ctx,text);
    for (uVar15 = 0; (len - 0x20 & 0xffffffe0) != uVar15; uVar15 = uVar15 + 0x20) {
      uVar1 = *(ulong *)(text + uVar15 + 0x20);
      uVar2 = *(ulong *)((long)(text + uVar15 + 0x20) + 8);
      uVar3 = *(ulong *)(text + uVar15 + 0x30);
      uVar18 = *(ulong *)((long)(text + uVar15 + 0x30) + 8);
      uStack_80 = (undefined4)uVar3;
      uStack_7c = (undefined4)(uVar3 >> 0x20);
      uVar4 = (uint)ctx[0xf][0];
      uVar5 = (uint)ctx[0xf][1];
      uVar6 = (uint)ctx[0x10][0];
      uVar7 = (uint)ctx[0x10][1];
      uVar8 = (uint)ctx[0x11][0];
      uVar9 = (uint)ctx[0x11][1];
      uVar10 = (uint)ctx[0x12][0];
      uVar11 = (uint)ctx[0x12][1];
      uVar24 = (uint)ctx[0x18][0];
      uVar31 = (uint)ctx[0x18][1];
      uVar17 = (*ctx)[0];
      uVar25 = (*ctx)[1];
      uVar35 = ctx[1][0];
      uVar40 = ctx[1][1];
      uVar41 = ctx[2][0];
      uVar48 = ctx[2][1];
      uVar51 = ctx[0x17][0];
      uVar55 = ctx[0x17][1];
      uVar57 = ctx[3][0];
      uVar59 = ctx[3][1];
      auVar42._0_8_ =
           (uVar57 & 0xffffffff) * (ulong)uVar4 + (uVar41 & 0xffffffff) * (ulong)uVar6 +
           (uVar35 & 0xffffffff) * (ulong)uVar8 + (uVar17 & 0xffffffff) * (ulong)uVar10;
      auVar42._8_8_ =
           (uVar59 & 0xffffffff) * (ulong)uVar5 + (uVar48 & 0xffffffff) * (ulong)uVar7 +
           (uVar40 & 0xffffffff) * (ulong)uVar9 + (uVar25 & 0xffffffff) * (ulong)uVar11;
      uVar12 = ctx[4][0];
      uVar13 = ctx[4][1];
      auVar58._0_8_ =
           (ctx[0x15][0] & 0xffffffffU) * (uVar12 & 0xffffffff) +
           (uVar57 & 0xffffffff) * (ctx[0x16][0] & 0xffffffffU) +
           (uVar41 & 0xffffffff) * (uVar51 & 0xffffffff) +
           (uVar35 & 0xffffffff) * (ulong)uVar24 + (uVar17 & 0xffffffff) * (ulong)uVar4;
      auVar58._8_8_ =
           (ctx[0x15][1] & 0xffffffffU) * (uVar13 & 0xffffffff) +
           (uVar59 & 0xffffffff) * (ctx[0x16][1] & 0xffffffffU) +
           (uVar48 & 0xffffffff) * (uVar55 & 0xffffffff) +
           (uVar40 & 0xffffffff) * (ulong)uVar31 + (uVar25 & 0xffffffff) * (ulong)uVar5;
      auVar36._0_8_ = (ctx[0x18][0] & 0xffffffffU) * (uVar12 & 0xffffffff) + auVar42._0_8_;
      auVar36._8_8_ = (ctx[0x18][1] & 0xffffffffU) * (uVar13 & 0xffffffff) + auVar42._8_8_;
      auVar19._0_8_ = uVar1 >> 0x1a;
      auVar19._8_8_ = uVar3 >> 0x1a;
      auVar43 = pmovsxdq(auVar42,0x3ffffff03ffffff);
      auVar63._0_8_ =
           (auVar58._0_8_ >> 0x1a) +
           (ctx[0x16][0] & 0xffffffffU) * (uVar12 & 0xffffffff) +
           (uVar57 & 0xffffffff) * (uVar51 & 0xffffffff) + (uVar41 & 0xffffffff) * (ulong)uVar24 +
           (uVar35 & 0xffffffff) * (ulong)uVar4 + (uVar17 & 0xffffffff) * (ulong)uVar6;
      auVar63._8_8_ =
           (auVar58._8_8_ >> 0x1a) +
           (ctx[0x16][1] & 0xffffffffU) * (uVar13 & 0xffffffff) +
           (uVar59 & 0xffffffff) * (uVar55 & 0xffffffff) + (uVar48 & 0xffffffff) * (ulong)uVar31 +
           (uVar40 & 0xffffffff) * (ulong)uVar5 + (uVar25 & 0xffffffff) * (ulong)uVar7;
      auVar60._0_8_ =
           (auVar36._0_8_ >> 0x1a) +
           (uVar12 & 0xffffffff) * (ulong)uVar4 +
           (uVar57 & 0xffffffff) * (ulong)uVar6 + (uVar41 & 0xffffffff) * (ulong)uVar8 +
           (uVar35 & 0xffffffff) * (ulong)uVar10 + (uVar17 & 0xffffffff) * (ulong)(uint)ctx[0x13][0]
      ;
      auVar60._8_8_ =
           (auVar36._8_8_ >> 0x1a) +
           (uVar13 & 0xffffffff) * (ulong)uVar5 +
           (uVar59 & 0xffffffff) * (ulong)uVar7 + (uVar48 & 0xffffffff) * (ulong)uVar9 +
           (uVar40 & 0xffffffff) * (ulong)uVar11 + (uVar25 & 0xffffffff) * (ulong)(uint)ctx[0x13][1]
      ;
      auVar56._0_8_ =
           (auVar63._0_8_ >> 0x1a) +
           (uVar51 & 0xffffffff) * (uVar12 & 0xffffffff) +
           (uVar57 & 0xffffffff) * (ulong)uVar24 + (uVar41 & 0xffffffff) * (ulong)uVar4 +
           (uVar35 & 0xffffffff) * (ulong)uVar6 + (uVar17 & 0xffffffff) * (ulong)uVar8;
      auVar56._8_8_ =
           (auVar63._8_8_ >> 0x1a) +
           (uVar55 & 0xffffffff) * (uVar13 & 0xffffffff) +
           (uVar59 & 0xffffffff) * (ulong)uVar31 + (uVar48 & 0xffffffff) * (ulong)uVar5 +
           (uVar40 & 0xffffffff) * (ulong)uVar7 + (uVar25 & 0xffffffff) * (ulong)uVar9;
      auVar26._0_8_ = (auVar60._0_8_ >> 0x1a) * 5 + SUB168(auVar58 & auVar43,0);
      auVar26._8_8_ = (auVar60._8_8_ >> 0x1a) * 5 + SUB168(auVar58 & auVar43,8);
      auVar20._0_8_ = (auVar56._0_8_ >> 0x1a) + SUB168(auVar36 & auVar43,0);
      auVar20._8_8_ = (auVar56._8_8_ >> 0x1a) + SUB168(auVar36 & auVar43,8);
      in_XMM2[0] = (auVar26._0_8_ >> 0x1a) +
                   SUB168(auVar63 & auVar43,0) + SUB168(auVar19 & auVar43,0);
      in_XMM2[1] = (auVar26._8_8_ >> 0x1a) +
                   SUB168(auVar63 & auVar43,8) + SUB168(auVar19 & auVar43,8);
      auVar14._8_4_ = uStack_80;
      auVar14._0_8_ = uVar1;
      auVar14._12_4_ = uStack_7c;
      auVar61._0_8_ = uVar2 >> 0xe;
      auVar61._8_8_ = uVar18 >> 0xe;
      (*ctx)[0] = SUB168(auVar26 & auVar43,0) + SUB168(auVar14 & auVar43,0);
      (*ctx)[1] = SUB168(auVar26 & auVar43,8) + SUB168(auVar14 & auVar43,8);
      ctx[1] = in_XMM2;
      ctx[2][0] = SUB168(auVar56 & auVar43,0) + ((uVar2 & 0x3fff) << 0xc | uVar1 >> 0x34);
      ctx[2][1] = SUB168(auVar56 & auVar43,8) + ((uVar18 & 0x3fff) << 0xc | uVar3 >> 0x34);
      ctx[3][0] = SUB168(auVar20 & auVar43,0) + SUB168(auVar61 & auVar43,0);
      ctx[3][1] = SUB168(auVar20 & auVar43,8) + SUB168(auVar61 & auVar43,8);
      ctx[4][0] = (auVar20._0_8_ >> 0x1a) + SUB168(auVar60 & auVar43,0) + (uVar2 >> 0x28) +
                  0x1000000;
      ctx[4][1] = (auVar20._8_8_ >> 0x1a) + SUB168(auVar60 & auVar43,8) + (uVar18 >> 0x28) +
                  0x1000000;
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(ctx,ctx + 5);
  }
  for (uVar15 = 0; (len & 0x10) != uVar15; uVar15 = uVar15 + 0x10) {
    uVar1 = *(ulong *)(text + uVar15 + uVar16);
    uVar24 = (uint)(uVar1 >> 0x20);
    auVar21._8_4_ = (int)uVar1;
    auVar21._0_8_ = uVar1;
    auVar21._12_4_ = uVar24;
    uVar2 = *(ulong *)(text + uVar15 + (ulong)uVar16 + 8);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar2;
    uVar31 = (uint)(uVar2 >> 0x20);
    auVar37._8_4_ = (int)uVar2;
    auVar37._0_8_ = uVar2;
    auVar37._12_4_ = uVar31;
    auVar43 = pmovsxdq(auVar27,0x3ffffff03ffffff);
    auVar52._0_8_ = uVar1 >> 0x1a;
    auVar52._8_8_ = auVar21._8_8_ >> 0x1a;
    uVar40 = auVar37._8_8_;
    auVar22._0_8_ = uVar2 >> 0xe;
    auVar22._8_8_ = uVar40 >> 0xe;
    uVar4 = (uint)ctx[5][0];
    uVar5 = (uint)ctx[5][1];
    uVar6 = (uint)ctx[6][0];
    uVar7 = (uint)ctx[6][1];
    uVar8 = (uint)ctx[7][0];
    uVar9 = (uint)ctx[7][1];
    uVar10 = (uint)ctx[8][0];
    uVar11 = (uint)ctx[8][1];
    uVar1 = ctx[0xe][0];
    uVar3 = ctx[0xe][1];
    uVar57 = SUB168(auVar21 & auVar43,0) + (*ctx)[0];
    uVar59 = SUB168(auVar21 & auVar43,8) + (*ctx)[1];
    uVar51 = SUB168(auVar52 & auVar43,0) + ctx[1][0];
    uVar55 = SUB168(auVar52 & auVar43,8) + ctx[1][1];
    uVar41 = ((uVar2 & 0x3fff) << 0xc | (ulong)(uVar24 >> 0x14)) + ctx[2][0];
    uVar48 = ((uVar40 & 0x3fff) << 0xc | auVar21._8_8_ >> 0x34) + ctx[2][1];
    uVar17 = SUB168(auVar22 & auVar43,0) + ctx[3][0];
    uVar25 = SUB168(auVar22 & auVar43,8) + ctx[3][1];
    uVar2 = ctx[0xd][0];
    uVar18 = ctx[0xd][1];
    uVar35 = (ulong)(uVar31 >> 8) + ctx[4][0] + 0x1000000;
    uVar40 = (uVar40 >> 0x28) + ctx[4][1] + 0x1000000;
    auVar53._0_8_ =
         (ctx[0xb][0] & 0xffffffffU) * (uVar35 & 0xffffffff) +
         (uVar17 & 0xffffffff) * (ctx[0xc][0] & 0xffffffffU) +
         (uVar51 & 0xffffffff) * (uVar1 & 0xffffffff) + (uVar57 & 0xffffffff) * (ulong)uVar4 +
         (uVar41 & 0xffffffff) * (uVar2 & 0xffffffff);
    auVar53._8_8_ =
         (ctx[0xb][1] & 0xffffffffU) * (uVar40 & 0xffffffff) +
         (uVar25 & 0xffffffff) * (ctx[0xc][1] & 0xffffffffU) +
         (uVar55 & 0xffffffff) * (uVar3 & 0xffffffff) + (uVar59 & 0xffffffff) * (ulong)uVar5 +
         (uVar48 & 0xffffffff) * (uVar18 & 0xffffffff);
    auVar32._0_8_ = (uVar41 & 0xffffffff) * (ulong)uVar4;
    auVar32._8_8_ = (uVar48 & 0xffffffff) * (ulong)uVar5;
    auVar62._0_8_ =
         (uVar1 & 0xffffffff) * (uVar35 & 0xffffffff) +
         (uVar17 & 0xffffffff) * (ulong)uVar4 +
         (uVar51 & 0xffffffff) * (ulong)uVar8 + (uVar57 & 0xffffffff) * (ulong)uVar10 +
         (uVar41 & 0xffffffff) * (ulong)uVar6;
    auVar62._8_8_ =
         (uVar3 & 0xffffffff) * (uVar40 & 0xffffffff) +
         (uVar25 & 0xffffffff) * (ulong)uVar5 +
         (uVar55 & 0xffffffff) * (ulong)uVar9 + (uVar59 & 0xffffffff) * (ulong)uVar11 +
         (uVar48 & 0xffffffff) * (ulong)uVar7;
    auVar49._0_8_ =
         (auVar53._0_8_ >> 0x1a) +
         (ctx[0xc][0] & 0xffffffffU) * (uVar35 & 0xffffffff) +
         (uVar17 & 0xffffffff) * (uVar2 & 0xffffffff) +
         (uVar51 & 0xffffffff) * (ulong)uVar4 + (uVar57 & 0xffffffff) * (ulong)uVar6 +
         (uVar41 & 0xffffffff) * (uVar1 & 0xffffffff);
    auVar49._8_8_ =
         (auVar53._8_8_ >> 0x1a) +
         (ctx[0xc][1] & 0xffffffffU) * (uVar40 & 0xffffffff) +
         (uVar25 & 0xffffffff) * (uVar18 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (ulong)uVar5 + (uVar59 & 0xffffffff) * (ulong)uVar7 +
         (uVar48 & 0xffffffff) * (uVar3 & 0xffffffff);
    auVar44._0_8_ =
         (auVar62._0_8_ >> 0x1a) +
         (uVar35 & 0xffffffff) * (ulong)uVar4 +
         (uVar17 & 0xffffffff) * (ulong)uVar6 +
         (uVar51 & 0xffffffff) * (ulong)uVar10 + (uVar57 & 0xffffffff) * (ulong)(uint)ctx[9][0] +
         (uVar41 & 0xffffffff) * (ulong)uVar8;
    auVar44._8_8_ =
         (auVar62._8_8_ >> 0x1a) +
         (uVar40 & 0xffffffff) * (ulong)uVar5 +
         (uVar25 & 0xffffffff) * (ulong)uVar7 +
         (uVar55 & 0xffffffff) * (ulong)uVar11 + (uVar59 & 0xffffffff) * (ulong)(uint)ctx[9][1] +
         (uVar48 & 0xffffffff) * (ulong)uVar9;
    auVar43 = pmovsxdq(auVar32,0x3ffffff03ffffff);
    auVar38._0_8_ =
         (auVar49._0_8_ >> 0x1a) +
         (uVar2 & 0xffffffff) * (uVar35 & 0xffffffff) +
         (uVar17 & 0xffffffff) * (uVar1 & 0xffffffff) +
         (uVar51 & 0xffffffff) * (ulong)uVar6 + (uVar57 & 0xffffffff) * (ulong)uVar8 + auVar32._0_8_
    ;
    auVar38._8_8_ =
         (auVar49._8_8_ >> 0x1a) +
         (uVar18 & 0xffffffff) * (uVar40 & 0xffffffff) +
         (uVar25 & 0xffffffff) * (uVar3 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (ulong)uVar7 + (uVar59 & 0xffffffff) * (ulong)uVar9 + auVar32._8_8_
    ;
    auVar23._0_8_ = (auVar44._0_8_ >> 0x1a) * 5 + SUB168(auVar53 & auVar43,0);
    auVar23._8_8_ = (auVar44._8_8_ >> 0x1a) * 5 + SUB168(auVar53 & auVar43,8);
    auVar28._0_8_ = (auVar38._0_8_ >> 0x1a) + SUB168(auVar62 & auVar43,0);
    auVar28._8_8_ = (auVar38._8_8_ >> 0x1a) + SUB168(auVar62 & auVar43,8);
    in_XMM2[0] = (auVar23._0_8_ >> 0x1a) + SUB168(auVar49 & auVar43,0);
    in_XMM2[1] = (auVar23._8_8_ >> 0x1a) + SUB168(auVar49 & auVar43,8);
    *ctx = (Lib_IntVector_Intrinsics_vec128)(auVar23 & auVar43);
    ctx[1] = in_XMM2;
    ctx[2] = (Lib_IntVector_Intrinsics_vec128)(auVar38 & auVar43);
    ctx[3] = (Lib_IntVector_Intrinsics_vec128)(auVar28 & auVar43);
    ctx[4][0] = (auVar28._0_8_ >> 0x1a) + SUB168(auVar44 & auVar43,0);
    ctx[4][1] = (auVar28._8_8_ >> 0x1a) + SUB168(auVar44 & auVar43,8);
  }
  local_48 = (undefined1  [16])0x0;
  memcpy(local_48,text + (len & 0xfffffff0),(ulong)(len & 0xf));
  if ((len & 0xf) != 0) {
    auVar43._8_4_ = local_48._8_4_;
    auVar43._12_4_ = local_48._12_4_;
    auVar29._0_8_ = local_48._0_8_;
    auVar29._8_4_ = local_48._0_4_;
    auVar29._12_4_ = local_48._4_4_;
    auVar43._0_8_ = local_48._8_8_;
    auVar33 = pmovsxdq((undefined1  [16])in_XMM2,0x3ffffff03ffffff);
    auVar45._0_8_ = auVar29._0_8_ >> 0x1a;
    auVar45._8_8_ = auVar29._8_8_ >> 0x1a;
    uVar17 = auVar43._8_8_;
    uVar16 = (uint)ctx[5][0];
    uVar4 = (uint)ctx[5][1];
    uVar5 = (uint)ctx[6][0];
    uVar6 = (uint)ctx[6][1];
    uVar7 = (uint)ctx[7][0];
    uVar8 = (uint)ctx[7][1];
    uVar9 = (uint)ctx[8][0];
    uVar10 = (uint)ctx[8][1];
    uVar48 = SUB168(auVar29 & auVar33,0) + (*ctx)[0];
    uVar51 = SUB168(auVar29 & auVar33,8) + (*ctx)[1];
    uVar40 = SUB168(auVar45 & auVar33,0) + ctx[1][0];
    uVar41 = SUB168(auVar45 & auVar33,8) + ctx[1][1];
    uVar25 = ((auVar43._0_8_ & 0x3fff) << 0xc | (ulong)(local_48._4_4_ >> 0x14)) + ctx[2][0];
    uVar35 = ((uVar17 & 0x3fff) << 0xc | auVar29._8_8_ >> 0x34) + ctx[2][1];
    uVar15 = ctx[0xe][0];
    uVar1 = ctx[0xe][1];
    uVar55 = (auVar43._0_8_ >> 0xe & 0x3ffffff) + ctx[3][0];
    uVar57 = (uVar17 >> 0xe & 0x3ffffff) + ctx[3][1];
    uVar2 = ctx[0xd][0];
    uVar3 = ctx[0xd][1];
    uVar18 = (ulong)(auVar43._12_4_ >> 8) + ctx[4][0] + 0x1000000;
    uVar17 = (uVar17 >> 0x28) + ctx[4][1] + 0x1000000;
    auVar46._0_8_ =
         (ctx[0xb][0] & 0xffffffffU) * (uVar18 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (ctx[0xc][0] & 0xffffffffU) +
         (uVar40 & 0xffffffff) * (uVar15 & 0xffffffff) + (uVar48 & 0xffffffff) * (ulong)uVar16 +
         (uVar25 & 0xffffffff) * (uVar2 & 0xffffffff);
    auVar46._8_8_ =
         (ctx[0xb][1] & 0xffffffffU) * (uVar17 & 0xffffffff) +
         (uVar57 & 0xffffffff) * (ctx[0xc][1] & 0xffffffffU) +
         (uVar41 & 0xffffffff) * (uVar1 & 0xffffffff) + (uVar51 & 0xffffffff) * (ulong)uVar4 +
         (uVar35 & 0xffffffff) * (uVar3 & 0xffffffff);
    auVar54._0_8_ =
         (ctx[0xc][0] & 0xffffffffU) * (uVar18 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (uVar2 & 0xffffffff) +
         (uVar40 & 0xffffffff) * (ulong)uVar16 + (uVar48 & 0xffffffff) * (ulong)uVar5 +
         (uVar25 & 0xffffffff) * (uVar15 & 0xffffffff);
    auVar54._8_8_ =
         (ctx[0xc][1] & 0xffffffffU) * (uVar17 & 0xffffffff) +
         (uVar57 & 0xffffffff) * (uVar3 & 0xffffffff) +
         (uVar41 & 0xffffffff) * (ulong)uVar4 + (uVar51 & 0xffffffff) * (ulong)uVar6 +
         (uVar35 & 0xffffffff) * (uVar1 & 0xffffffff);
    auVar50._0_8_ =
         (uVar15 & 0xffffffff) * (uVar18 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (ulong)uVar16 +
         (uVar40 & 0xffffffff) * (ulong)uVar7 + (uVar48 & 0xffffffff) * (ulong)uVar9 +
         (uVar25 & 0xffffffff) * (ulong)uVar5;
    auVar50._8_8_ =
         (uVar1 & 0xffffffff) * (uVar17 & 0xffffffff) +
         (uVar57 & 0xffffffff) * (ulong)uVar4 +
         (uVar41 & 0xffffffff) * (ulong)uVar8 + (uVar51 & 0xffffffff) * (ulong)uVar10 +
         (uVar35 & 0xffffffff) * (ulong)uVar6;
    auVar39._0_8_ = (auVar46._0_8_ >> 0x1a) + auVar54._0_8_;
    auVar39._8_8_ = (auVar46._8_8_ >> 0x1a) + auVar54._8_8_;
    auVar34._0_8_ =
         (auVar50._0_8_ >> 0x1a) +
         (uVar18 & 0xffffffff) * (ulong)uVar16 +
         (uVar55 & 0xffffffff) * (ulong)uVar5 +
         (uVar40 & 0xffffffff) * (ulong)uVar9 + (uVar48 & 0xffffffff) * (ulong)(uint)ctx[9][0] +
         (uVar25 & 0xffffffff) * (ulong)uVar7;
    auVar34._8_8_ =
         (auVar50._8_8_ >> 0x1a) +
         (uVar17 & 0xffffffff) * (ulong)uVar4 +
         (uVar57 & 0xffffffff) * (ulong)uVar6 +
         (uVar41 & 0xffffffff) * (ulong)uVar10 + (uVar51 & 0xffffffff) * (ulong)(uint)ctx[9][1] +
         (uVar35 & 0xffffffff) * (ulong)uVar8;
    auVar43 = pmovsxdq(auVar54,0x3ffffff03ffffff);
    auVar33._0_8_ =
         (auVar39._0_8_ >> 0x1a) +
         (uVar2 & 0xffffffff) * (uVar18 & 0xffffffff) +
         (uVar55 & 0xffffffff) * (uVar15 & 0xffffffff) +
         (uVar40 & 0xffffffff) * (ulong)uVar5 + (uVar48 & 0xffffffff) * (ulong)uVar7 +
         (uVar25 & 0xffffffff) * (ulong)uVar16;
    auVar33._8_8_ =
         (auVar39._8_8_ >> 0x1a) +
         (uVar3 & 0xffffffff) * (uVar17 & 0xffffffff) +
         (uVar57 & 0xffffffff) * (uVar1 & 0xffffffff) +
         (uVar41 & 0xffffffff) * (ulong)uVar6 + (uVar51 & 0xffffffff) * (ulong)uVar8 +
         (uVar35 & 0xffffffff) * (ulong)uVar4;
    auVar30._0_8_ = (auVar34._0_8_ >> 0x1a) * 5 + SUB168(auVar46 & auVar43,0);
    auVar30._8_8_ = (auVar34._8_8_ >> 0x1a) * 5 + SUB168(auVar46 & auVar43,8);
    auVar47._0_8_ = (auVar33._0_8_ >> 0x1a) + SUB168(auVar50 & auVar43,0);
    auVar47._8_8_ = (auVar33._8_8_ >> 0x1a) + SUB168(auVar50 & auVar43,8);
    *ctx = (Lib_IntVector_Intrinsics_vec128)(auVar30 & auVar43);
    ctx[1][0] = (auVar30._0_8_ >> 0x1a) + SUB168(auVar39 & auVar43,0);
    ctx[1][1] = (auVar30._8_8_ >> 0x1a) + SUB168(auVar39 & auVar43,8);
    ctx[2] = (Lib_IntVector_Intrinsics_vec128)(auVar33 & auVar43);
    ctx[3] = (Lib_IntVector_Intrinsics_vec128)(auVar47 & auVar43);
    ctx[4][0] = (auVar47._0_8_ >> 0x1a) + SUB168(auVar34 & auVar43,0);
    ctx[4][1] = (auVar47._8_8_ >> 0x1a) + SUB168(auVar34 & auVar43,8);
  }
  return;
}

Assistant:

static inline void
poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx, uint32_t len, uint8_t *text)
{
  uint32_t n = len / 16U;
  uint32_t r = len % 16U;
  uint8_t *blocks = text;
  uint8_t *rem = text + n * 16U;
  Lib_IntVector_Intrinsics_vec128 *pre0 = ctx + 5U;
  Lib_IntVector_Intrinsics_vec128 *acc0 = ctx;
  uint32_t sz_block = 32U;
  uint32_t len0 = n * 16U / sz_block * sz_block;
  uint8_t *t00 = blocks;
  if (len0 > 0U)
  {
    uint32_t bs = 32U;
    uint8_t *text0 = t00;
    Hacl_MAC_Poly1305_Simd128_load_acc2(acc0, text0);
    uint32_t len1 = len0 - bs;
    uint8_t *text1 = t00 + bs;
    uint32_t nb = len1 / bs;
    for (uint32_t i = 0U; i < nb; i++)
    {
      uint8_t *block = text1 + i * bs;
      KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
      Lib_IntVector_Intrinsics_vec128 b1 = Lib_IntVector_Intrinsics_vec128_load64_le(block);
      Lib_IntVector_Intrinsics_vec128 b2 = Lib_IntVector_Intrinsics_vec128_load64_le(block + 16U);
      Lib_IntVector_Intrinsics_vec128 lo = Lib_IntVector_Intrinsics_vec128_interleave_low64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      hi = Lib_IntVector_Intrinsics_vec128_interleave_high64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      f00 =
        Lib_IntVector_Intrinsics_vec128_and(lo,
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f15 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 26U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f25 =
        Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 52U),
          Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(hi,
              Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
            12U));
      Lib_IntVector_Intrinsics_vec128
      f30 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 14U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 40U);
      Lib_IntVector_Intrinsics_vec128 f0 = f00;
      Lib_IntVector_Intrinsics_vec128 f1 = f15;
      Lib_IntVector_Intrinsics_vec128 f2 = f25;
      Lib_IntVector_Intrinsics_vec128 f3 = f30;
      Lib_IntVector_Intrinsics_vec128 f41 = f40;
      e[0U] = f0;
      e[1U] = f1;
      e[2U] = f2;
      e[3U] = f3;
      e[4U] = f41;
      uint64_t b = 0x1000000ULL;
      Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
      Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
      e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
      Lib_IntVector_Intrinsics_vec128 *rn = pre0 + 10U;
      Lib_IntVector_Intrinsics_vec128 *rn5 = pre0 + 15U;
      Lib_IntVector_Intrinsics_vec128 r0 = rn[0U];
      Lib_IntVector_Intrinsics_vec128 r1 = rn[1U];
      Lib_IntVector_Intrinsics_vec128 r2 = rn[2U];
      Lib_IntVector_Intrinsics_vec128 r3 = rn[3U];
      Lib_IntVector_Intrinsics_vec128 r4 = rn[4U];
      Lib_IntVector_Intrinsics_vec128 r51 = rn5[1U];
      Lib_IntVector_Intrinsics_vec128 r52 = rn5[2U];
      Lib_IntVector_Intrinsics_vec128 r53 = rn5[3U];
      Lib_IntVector_Intrinsics_vec128 r54 = rn5[4U];
      Lib_IntVector_Intrinsics_vec128 f10 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f110 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f120 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f130 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f140 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 a0 = Lib_IntVector_Intrinsics_vec128_mul64(r0, f10);
      Lib_IntVector_Intrinsics_vec128 a1 = Lib_IntVector_Intrinsics_vec128_mul64(r1, f10);
      Lib_IntVector_Intrinsics_vec128 a2 = Lib_IntVector_Intrinsics_vec128_mul64(r2, f10);
      Lib_IntVector_Intrinsics_vec128 a3 = Lib_IntVector_Intrinsics_vec128_mul64(r3, f10);
      Lib_IntVector_Intrinsics_vec128 a4 = Lib_IntVector_Intrinsics_vec128_mul64(r4, f10);
      Lib_IntVector_Intrinsics_vec128
      a01 =
        Lib_IntVector_Intrinsics_vec128_add64(a0,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f110));
      Lib_IntVector_Intrinsics_vec128
      a11 =
        Lib_IntVector_Intrinsics_vec128_add64(a1,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f110));
      Lib_IntVector_Intrinsics_vec128
      a21 =
        Lib_IntVector_Intrinsics_vec128_add64(a2,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f110));
      Lib_IntVector_Intrinsics_vec128
      a31 =
        Lib_IntVector_Intrinsics_vec128_add64(a3,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f110));
      Lib_IntVector_Intrinsics_vec128
      a41 =
        Lib_IntVector_Intrinsics_vec128_add64(a4,
          Lib_IntVector_Intrinsics_vec128_mul64(r3, f110));
      Lib_IntVector_Intrinsics_vec128
      a02 =
        Lib_IntVector_Intrinsics_vec128_add64(a01,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f120));
      Lib_IntVector_Intrinsics_vec128
      a12 =
        Lib_IntVector_Intrinsics_vec128_add64(a11,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f120));
      Lib_IntVector_Intrinsics_vec128
      a22 =
        Lib_IntVector_Intrinsics_vec128_add64(a21,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f120));
      Lib_IntVector_Intrinsics_vec128
      a32 =
        Lib_IntVector_Intrinsics_vec128_add64(a31,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f120));
      Lib_IntVector_Intrinsics_vec128
      a42 =
        Lib_IntVector_Intrinsics_vec128_add64(a41,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f120));
      Lib_IntVector_Intrinsics_vec128
      a03 =
        Lib_IntVector_Intrinsics_vec128_add64(a02,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f130));
      Lib_IntVector_Intrinsics_vec128
      a13 =
        Lib_IntVector_Intrinsics_vec128_add64(a12,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f130));
      Lib_IntVector_Intrinsics_vec128
      a23 =
        Lib_IntVector_Intrinsics_vec128_add64(a22,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f130));
      Lib_IntVector_Intrinsics_vec128
      a33 =
        Lib_IntVector_Intrinsics_vec128_add64(a32,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f130));
      Lib_IntVector_Intrinsics_vec128
      a43 =
        Lib_IntVector_Intrinsics_vec128_add64(a42,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f130));
      Lib_IntVector_Intrinsics_vec128
      a04 =
        Lib_IntVector_Intrinsics_vec128_add64(a03,
          Lib_IntVector_Intrinsics_vec128_mul64(r51, f140));
      Lib_IntVector_Intrinsics_vec128
      a14 =
        Lib_IntVector_Intrinsics_vec128_add64(a13,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f140));
      Lib_IntVector_Intrinsics_vec128
      a24 =
        Lib_IntVector_Intrinsics_vec128_add64(a23,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f140));
      Lib_IntVector_Intrinsics_vec128
      a34 =
        Lib_IntVector_Intrinsics_vec128_add64(a33,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f140));
      Lib_IntVector_Intrinsics_vec128
      a44 =
        Lib_IntVector_Intrinsics_vec128_add64(a43,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f140));
      Lib_IntVector_Intrinsics_vec128 t01 = a04;
      Lib_IntVector_Intrinsics_vec128 t1 = a14;
      Lib_IntVector_Intrinsics_vec128 t2 = a24;
      Lib_IntVector_Intrinsics_vec128 t3 = a34;
      Lib_IntVector_Intrinsics_vec128 t4 = a44;
      Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
      Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
      Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
      Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
      Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
      Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
      Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
      Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
      Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
      Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
      Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
      Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
      Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
      Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
      Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
      Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
      Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
      Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
      Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
      Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
      Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
      Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
      Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
      Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
      Lib_IntVector_Intrinsics_vec128 o00 = x02;
      Lib_IntVector_Intrinsics_vec128 o10 = x12;
      Lib_IntVector_Intrinsics_vec128 o20 = x21;
      Lib_IntVector_Intrinsics_vec128 o30 = x32;
      Lib_IntVector_Intrinsics_vec128 o40 = x42;
      acc0[0U] = o00;
      acc0[1U] = o10;
      acc0[2U] = o20;
      acc0[3U] = o30;
      acc0[4U] = o40;
      Lib_IntVector_Intrinsics_vec128 f100 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f11 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f12 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f13 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f14 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 f20 = e[0U];
      Lib_IntVector_Intrinsics_vec128 f21 = e[1U];
      Lib_IntVector_Intrinsics_vec128 f22 = e[2U];
      Lib_IntVector_Intrinsics_vec128 f23 = e[3U];
      Lib_IntVector_Intrinsics_vec128 f24 = e[4U];
      Lib_IntVector_Intrinsics_vec128 o0 = Lib_IntVector_Intrinsics_vec128_add64(f100, f20);
      Lib_IntVector_Intrinsics_vec128 o1 = Lib_IntVector_Intrinsics_vec128_add64(f11, f21);
      Lib_IntVector_Intrinsics_vec128 o2 = Lib_IntVector_Intrinsics_vec128_add64(f12, f22);
      Lib_IntVector_Intrinsics_vec128 o3 = Lib_IntVector_Intrinsics_vec128_add64(f13, f23);
      Lib_IntVector_Intrinsics_vec128 o4 = Lib_IntVector_Intrinsics_vec128_add64(f14, f24);
      acc0[0U] = o0;
      acc0[1U] = o1;
      acc0[2U] = o2;
      acc0[3U] = o3;
      acc0[4U] = o4;
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(acc0, pre0);
  }
  uint32_t len1 = n * 16U - len0;
  uint8_t *t10 = blocks + len0;
  uint32_t nb = len1 / 16U;
  uint32_t rem1 = len1 % 16U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *block = t10 + i * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(block);
    uint64_t lo = u0;
    uint64_t u = load64_le(block + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  if (rem1 > 0U)
  {
    uint8_t *last = t10 + nb * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint8_t tmp[16U] = { 0U };
    memcpy(tmp, last, rem1 * sizeof (uint8_t));
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f4 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f4;
    uint64_t b = 1ULL << rem1 * 8U % 26U;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 fi = e[rem1 * 8U / 26U];
    e[rem1 * 8U / 26U] = Lib_IntVector_Intrinsics_vec128_or(fi, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  uint8_t tmp[16U] = { 0U };
  memcpy(tmp, rem, r * sizeof (uint8_t));
  if (r > 0U)
  {
    Lib_IntVector_Intrinsics_vec128 *pre = ctx + 5U;
    Lib_IntVector_Intrinsics_vec128 *acc = ctx;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t0 = a06;
    Lib_IntVector_Intrinsics_vec128 t1 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t0, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t0, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc[0U] = o0;
    acc[1U] = o1;
    acc[2U] = o2;
    acc[3U] = o3;
    acc[4U] = o4;
    return;
  }
}